

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.h
# Opt level: O2

bool __thiscall Assimp::Q3Shader::ShaderDataBlock::operator==(ShaderDataBlock *this,string *o)

{
  int iVar1;
  
  iVar1 = ASSIMP_stricmp(o,&this->name);
  return iVar1 == 0;
}

Assistant:

bool operator== (const std::string& o) const {
        return !ASSIMP_stricmp(o,name);
    }